

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O3

void __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::deinit
          (TextureBorderClampParameterTextureBorderColor *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar4;
  
  iVar2 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  puVar5 = (this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_texture_targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      (**(code **)(lVar4 + 0xb8))(puVar5[uVar6],0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error binding texture object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
                      ,0x45);
      puVar5 = (this->m_texture_targets).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = uVar7 < (ulong)((long)(this->m_texture_targets).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  (**(code **)(lVar4 + 0xa8))(0,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error binding sampler object to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
                  ,0x49);
  if (this->m_to_id != 0) {
    (**(code **)(lVar4 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_sampler_id != 0) {
    (**(code **)(lVar4 + 0x468))(1,&this->m_sampler_id);
    this->m_sampler_id = 0;
  }
  TestCaseBase::deinit((TestCaseBase *)this);
  return;
}

Assistant:

void TextureBorderClampParameterTextureBorderColor::deinit(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < m_texture_targets.size(); ++i)
	{
		gl.bindTexture(m_texture_targets[i], 0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");
	}

	gl.bindSampler(m_texture_unit_index, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding sampler object to texture unit!");

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_sampler_id != 0)
	{
		gl.deleteSamplers(1, &m_sampler_id);

		m_sampler_id = 0;
	}

	/* Deinitialize base class */
	TestCaseBase::deinit();
}